

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instimpl.cpp
# Opt level: O0

Error asmjit::X86InstImpl::validate
                (uint32_t archType,Detail *detail,Operand_ *operands,uint32_t count)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  uint in_ECX;
  long lVar7;
  uint *in_RDX;
  uint *in_RSI;
  uint in_EDI;
  bool bVar8;
  uint32_t size;
  uint32_t kAvx512Options;
  RegOnly *extraReg;
  OSignature *oRef;
  OSignature *oChk;
  uint32_t r;
  bool localImmOutOfRange;
  uint32_t iSigCount;
  uint32_t j;
  bool globalImmOutOfRange;
  OSignature *oSigData;
  ISignature *iEnd;
  ISignature *iSig;
  CommonData *commonData;
  OSignature *tod;
  uint32_t k32AndMore;
  uint32_t immFlags;
  uint64_t immValue;
  uint32_t indexId;
  int64_t offset;
  uint32_t baseId;
  uint32_t indexType;
  uint32_t baseType;
  X86Mem *m;
  uint32_t regId;
  uint32_t regType;
  uint32_t regMask;
  uint32_t memFlags;
  uint32_t opFlags;
  Operand_ *op;
  X86Mem *memOp;
  uint32_t combinedRegMask;
  uint32_t combinedOpFlags;
  OSignature oSigTranslated [6];
  uint32_t kRepRepRepnz;
  uint32_t kLockXAcqRel;
  uint32_t iFlags;
  X86Inst *iData;
  uint32_t options;
  uint32_t instId;
  X86ValidationData *vd;
  uint32_t archMask;
  uint32_t i;
  uint32_t refRegMask_1;
  uint32_t refMemFlags_1;
  uint32_t opMemFlags_1;
  uint32_t opFlags_2;
  uint32_t refRegMask;
  uint32_t refMemFlags;
  uint32_t opMemFlags;
  uint32_t opFlags_1;
  bool local_595;
  bool local_594;
  bool local_591;
  bool local_582;
  ulong local_580;
  bool local_564;
  uint local_53c;
  char local_535;
  uint local_534;
  uint local_530;
  char local_529;
  undefined1 *local_528;
  byte *local_520;
  byte *local_518;
  uint *local_510;
  uint *local_508;
  undefined4 local_500;
  uint local_4fc;
  ulong local_4f8;
  uint local_4ec;
  ulong local_4e8;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint *local_4d0;
  uint local_4c4;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  uint *local_4b0;
  uint *local_4a8;
  uint local_4a0;
  uint local_49c;
  uint local_498;
  ushort uStackY_494;
  byte abStackY_491 [45];
  undefined4 local_464;
  undefined4 local_460;
  uint local_45c;
  ulong *local_458;
  uint local_450;
  uint local_44c;
  undefined1 *local_448;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint *local_430;
  uint *local_428;
  Error local_41c;
  ulong *local_380;
  uint *local_368;
  uint *local_360;
  uint *local_358;
  uint *local_350;
  uint *local_348;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint *local_330;
  uint *local_328;
  uint *local_320;
  uint *local_318;
  uint *local_310;
  uint *local_308;
  uint *local_300;
  uint *local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  uint *local_2e0;
  uint *local_2d8;
  uint *local_2d0;
  uint *local_2c8;
  uint *local_2c0;
  uint *local_2b8;
  uint *local_2b0;
  ulong *local_2a8;
  ulong *local_2a0;
  uint local_298;
  uint local_294;
  uint local_290;
  uint local_28c;
  char *local_288;
  uint *local_280;
  uint *local_278;
  char local_269;
  uint local_268;
  uint local_264;
  uint local_260;
  uint local_25c;
  char *local_258;
  uint *local_250;
  uint *local_248;
  char local_239;
  uint *local_238;
  uint *local_230;
  undefined4 local_224;
  uint *local_220;
  uint *local_218;
  uint *local_210;
  undefined4 local_204;
  uint *local_200;
  uint *local_1f8;
  undefined4 local_1ec;
  uint *local_1e8;
  uint *local_1e0;
  undefined4 local_1d4;
  uint *local_1d0;
  uint *local_1c8;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  uint *in_stack_fffffffffffffe48;
  int line;
  char *in_stack_fffffffffffffe50;
  
  if (in_EDI == 0 || 3 < in_EDI) {
    local_41c = 5;
  }
  else {
    if (in_EDI == 1) {
      local_448 = _x86ValidationData;
      local_43c = 1;
    }
    else {
      local_448 = _x64ValidationData;
      local_43c = 2;
    }
    local_44c = *in_RSI;
    local_450 = in_RSI[1];
    if (local_44c < 0x59c) {
      local_458 = (ulong *)(X86InstDB::instData + (ulong)local_44c * 0xc);
      local_45c = *(uint *)(X86InstDB::commonData +
                           (ulong)((uint)(*local_458 >> 0x16) & 0x3ff) * 0xc);
      local_460 = 0x30000;
      if ((local_450 & 0x32000) != 0) {
        if ((local_450 & 0x2000) != 0) {
          if ((local_45c & 0x4000) == 0 && (local_450 & 0x30000) == 0) {
            return 0x1c;
          }
          bVar8 = true;
          if (in_ECX != 0) {
            bVar8 = (*in_RDX & 7) != 2;
          }
          if (bVar8) {
            return 0x1c;
          }
        }
        if ((local_450 & 0x30000) != 0) {
          local_564 = (local_450 & 0x2000) == 0 || (local_450 & 0x30000) == 0x30000;
          if (local_564) {
            return 0x1b;
          }
          if ((local_450 & 0x10000) != 0 && (local_45c & 0x8000) == 0) {
            return 0x1d;
          }
          if ((local_450 & 0x20000) != 0 && (local_45c & 0x10000) == 0) {
            return 0x1e;
          }
        }
      }
      local_464 = 0xc000;
      if ((local_450 & 0xc000) != 0) {
        if ((local_450 & 0xc000) == 0xc000) {
          return 0x1b;
        }
        if ((local_450 & 0x4000) != 0 && (local_45c & 0x1000) == 0) {
          return 0x1f;
        }
        if ((local_450 & 0x8000) != 0 && (local_45c & 0x2000) == 0) {
          return 0x1f;
        }
      }
      local_49c = 0;
      local_4a0 = 0;
      local_4a8 = (uint *)0x0;
      local_438 = 0;
      local_434 = in_ECX;
      local_430 = in_RDX;
      local_428 = in_RSI;
      local_380 = local_458;
      local_2a8 = local_458;
      while ((line = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20), local_438 < local_434 &&
             (local_4b0 = local_430 + (ulong)local_438 * 4, local_360 = local_4b0,
             (*local_4b0 & 7) != 0))) {
        local_4b4 = 0;
        local_4b8 = 0;
        local_4bc = 0;
        local_368 = local_4b0;
        switch(*local_4b0 & 7) {
        case 1:
          local_4c0 = *local_4b0 >> 3 & 0x1f;
          if (0x15 < local_4c0) {
            return 0x17;
          }
          local_4b4 = *(uint *)(_x86OpFlagFromRegType + (ulong)local_4c0 * 4);
          if (local_4b4 == 0) {
            return 0x17;
          }
          local_4c4 = local_4b0[1];
          local_358 = local_4b0;
          local_350 = local_4b0;
          local_348 = local_4b0;
          if (local_4c4 < 0x100) {
            if (0x1f < local_4c4) {
              return 0x19;
            }
            local_334 = local_4c4;
            if (0x1f < local_4c4) {
              DebugUtils::assertionFailed
                        (in_stack_fffffffffffffe50,line,
                         (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            }
            local_4bc = 1 << ((byte)local_4c4 & 0x1f);
            if ((*(uint *)(local_448 + (ulong)local_4c0 * 4) & local_4bc) == 0) {
              return 0x19;
            }
            local_4a0 = local_4bc | local_4a0;
          }
          else {
            local_4bc = 0xffffffff;
          }
          break;
        case 2:
          local_4d4 = *local_4b0 >> 3 & 0x1f;
          local_4d8 = *local_4b0 >> 8 & 0x1f;
          if (6 < (*local_4b0 >> 0x15 & 7)) {
            return 0x2b;
          }
          local_4d0 = local_4b0;
          local_4a8 = local_4b0;
          local_330 = local_4b0;
          local_328 = local_4b0;
          local_320 = local_4b0;
          local_318 = local_4b0;
          if (local_4d4 == 0) {
            if ((*local_4b0 >> 3 & 0x1f) == 0) {
              local_580 = *(ulong *)(local_4b0 + 2);
            }
            else {
              local_580 = (ulong)(int)local_4b0[2];
            }
            local_4e8 = local_580;
            local_2f8 = local_4b0;
            if ((local_43c == 1) &&
               (local_2f0 = local_580, (long)local_580 < -0x80000000 || 0x7fffffff < (long)local_580
               )) {
              local_2e8 = local_580;
              local_582 = 0xffffffff < local_580;
              if (local_582) {
                return 0x26;
              }
            }
          }
          else {
            local_4dc = local_4b0[3];
            if (((*local_4b0 & 0x10000) == 0) &&
               ((*(uint *)(local_448 + 0x80) & 1 << (sbyte)local_4d4) == 0)) {
              return 0x26;
            }
            local_310 = local_4b0;
            local_308 = local_4b0;
            if (local_4dc < 0x100) {
              local_338 = local_4dc;
              if (0x1f < local_4dc) {
                DebugUtils::assertionFailed
                          (in_stack_fffffffffffffe50,line,
                           (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              }
              local_4bc = 1 << ((byte)local_4dc & 0x1f);
              local_4a0 = local_4bc | local_4a0;
            }
            else {
              local_4bc = 0xffffffff;
            }
            if ((local_4d8 == 0) && (local_300 = local_4b0, local_4b0[2] == 0)) {
              local_4b8 = 0x800;
            }
          }
          if (local_4d8 == 0) {
            local_4b4 = 0x10000;
          }
          else {
            if ((*(uint *)(local_448 + 0x84) & 1 << (sbyte)local_4d8) == 0) {
              return 0x26;
            }
            if (local_4d8 == 9) {
              local_4b4 = 0x20000;
              local_4b8 = local_4b8 | 0x11;
            }
            else if (local_4d8 == 10) {
              local_4b4 = 0x20000;
              local_4b8 = local_4b8 | 0x22;
            }
            else if (local_4d8 == 0xb) {
              local_4b4 = 0x20000;
              local_4b8 = local_4b8 | 0x44;
            }
            else {
              local_4b4 = 0x10000;
              if (local_4d4 != 0) {
                local_4b8 = local_4b8 | 0x4000;
              }
            }
            if ((local_4d4 == 0xe) && ((local_4b4 & 0x20000) != 0)) {
              return 0x26;
            }
            local_4ec = local_4b0[1];
            local_2e0 = local_4b0;
            if (local_4ec < 0x100) {
              local_33c = local_4ec;
              if (0x1f < local_4ec) {
                DebugUtils::assertionFailed
                          (in_stack_fffffffffffffe50,line,
                           (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              }
              local_4a0 = 1 << ((byte)local_4ec & 0x1f) | local_4a0;
            }
            local_4bc = 0;
          }
          local_2d0 = local_4b0;
          switch(*local_4b0 >> 0x18) {
          case 0:
            local_4b8 = local_4b8 | 0x8000;
            break;
          case 1:
            local_4b8 = local_4b8 | 1;
            break;
          case 2:
            local_4b8 = local_4b8 | 2;
            break;
          default:
            return 0x2d;
          case 4:
            local_4b8 = local_4b8 | 4;
            break;
          case 6:
            local_4b8 = local_4b8 | 8;
            break;
          case 8:
            local_4b8 = local_4b8 | 0x10;
            break;
          case 10:
            local_4b8 = local_4b8 | 0x20;
            break;
          case 0x10:
            local_4b8 = local_4b8 | 0x40;
            break;
          case 0x20:
            local_4b8 = local_4b8 | 0x80;
            break;
          case 0x40:
            local_4b8 = local_4b8 | 0x100;
          }
          break;
        case 3:
          local_4f8 = *(ulong *)(local_4b0 + 2);
          if ((long)local_4f8 < 0) {
            local_4f8 = (local_4f8 ^ 0xffffffffffffffff) + 1;
            if (local_4f8 < 0x81) {
              local_4fc = 0x2a80000;
            }
            else if (local_4f8 < 0x8001) {
              local_4fc = 0x2a00000;
            }
            else if (local_4f8 < 0x80000001) {
              local_4fc = 0x2800000;
            }
            else {
              local_4fc = 0x2000000;
            }
          }
          else {
            local_500 = 0x7800000;
            if (local_4f8 < 0x10) {
              local_4fc = 0x7fc0000;
            }
            else if (local_4f8 < 0x80) {
              local_4fc = 0x7f80000;
            }
            else if (local_4f8 < 0x100) {
              local_4fc = 0x7f00000;
            }
            else if (local_4f8 < 0x8000) {
              local_4fc = 0x7e00000;
            }
            else if (local_4f8 < 0x10000) {
              local_4fc = 0x7c00000;
            }
            else if (local_4f8 < 0x80000000) {
              local_4fc = 0x7800000;
            }
            else if (local_4f8 < 0x100000000) {
              local_4fc = 0x7000000;
            }
            else if (local_4f8 < 0x8000000000000000) {
              local_4fc = 0x6000000;
            }
            else {
              local_4fc = 0x4000000;
            }
          }
          local_4b4 = local_4fc;
          local_2c8 = local_4b0;
          local_2c0 = local_4b0;
          break;
        case 4:
          local_4b4 = 0x18000000;
          break;
        default:
          return 4;
        }
        uVar4 = (ulong)local_438;
        local_508 = &local_498 + uVar4 * 2;
        *local_508 = local_4b4;
        (&uStackY_494)[uVar4 * 4] = (ushort)local_4b8;
        abStackY_491[uVar4 * 8] = (byte)local_4bc;
        local_49c = local_4b4 | local_49c;
        local_438 = local_438 + 1;
      }
      if (local_438 < local_434) {
        do {
          local_434 = local_434 - 1;
          if (local_434 <= local_438) goto LAB_002213a9;
          local_2b8 = local_430 + (ulong)local_434 * 4;
          local_2b0 = local_2b8;
        } while ((*local_2b8 & 7) == 0);
        local_41c = 4;
      }
      else {
LAB_002213a9:
        if (local_43c == 1) {
          if ((local_49c & 0x10) != 0) {
            return 0x32;
          }
        }
        else {
          local_591 = (local_49c & 2) != 0 && (local_4a0 & 0xffffff00) != 0;
          if (local_591) {
            return 0x31;
          }
        }
        local_2a0 = local_458;
        lVar7 = (ulong)((uint)(*local_458 >> 0x16) & 0x3ff) * 0xc;
        local_510 = (uint *)(X86InstDB::commonData + lVar7);
        local_518 = X86InstDB::iSignatureData +
                    (long)(int)((uint)((ulong)*(undefined8 *)(X86InstDB::commonData + lVar7 + 4) >>
                                      0x28) & 0x3ff) * 8;
        local_520 = local_518 +
                    (long)(int)((uint)((ulong)*(undefined8 *)(X86InstDB::commonData + lVar7 + 4) >>
                                      0x32) & 0xf) * 8;
        if (local_518 != local_520) {
          local_528 = X86InstDB::oSignatureData;
          local_529 = '\0';
          do {
            if (((*local_518 >> 3 & 3) & local_43c) != 0) {
              local_530 = 0;
              local_534 = (uint)(*local_518 & 7);
              local_535 = '\0';
              if (local_534 == local_434) {
                for (local_530 = 0; local_530 < local_434; local_530 = local_530 + 1) {
                  uVar4 = (ulong)local_530;
                  local_248 = &local_498 + uVar4 * 2;
                  lVar7 = (ulong)local_518[(ulong)local_530 + 2] * 8;
                  local_250 = (uint *)(X86InstDB::oSignatureData + lVar7);
                  local_258 = &local_535;
                  local_25c = *local_248;
                  if ((local_25c & *local_250) == 0) {
                    if (((local_25c & 0x7fc0000) == 0) || ((*local_250 & 0x7fc0000) == 0)) {
                      local_239 = '\0';
                    }
                    else {
                      local_535 = '\x01';
                      local_239 = '\x01';
                    }
                  }
                  else {
                    uVar1 = (&uStackY_494)[uVar4 * 4];
                    local_260 = (uint)uVar1;
                    if (local_260 == 0) {
LAB_002216d6:
                      if ((local_25c & 0x7fff) != 0) {
                        local_268 = (uint)(byte)X86InstDB::oSignatureData[lVar7 + 7];
                        if ((local_268 != 0) &&
                           ((abStackY_491[uVar4 * 8] & X86InstDB::oSignatureData[lVar7 + 7]) == 0))
                        {
                          local_239 = '\0';
                          goto LAB_00221730;
                        }
                      }
                      local_239 = '\x01';
                    }
                    else {
                      uVar2 = *(ushort *)(X86InstDB::oSignatureData + lVar7 + 4);
                      local_264 = (uint)uVar2;
                      if ((uVar2 & uVar1) == 0) {
                        local_239 = '\0';
                      }
                      else {
                        if (((uVar2 & 0x800) == 0) || ((uVar1 & 0x800) != 0)) goto LAB_002216d6;
                        local_239 = '\0';
                      }
                    }
                  }
LAB_00221730:
                  if (local_239 == '\0') break;
                }
              }
              else if (local_534 - (*local_518 >> 5) == local_434) {
                local_53c = 0;
                for (local_530 = 0; local_530 < local_434 && local_53c < local_534;
                    local_530 = local_530 + 1) {
                  uVar4 = (ulong)local_530;
                  puVar5 = &local_498 + uVar4 * 2;
                  while( true ) {
                    lVar7 = (long)(int)(uint)local_518[(ulong)local_53c + 2] * 8;
                    puVar6 = (uint *)(X86InstDB::oSignatureData + lVar7);
                    if ((*puVar6 & 0x80000000) == 0) break;
                    local_53c = local_53c + 1;
                    if (local_534 <= local_53c) goto LAB_002219dc;
                  }
                  local_288 = &local_535;
                  local_28c = *puVar5;
                  if ((local_28c & *puVar6) == 0) {
                    if (((local_28c & 0x7fc0000) == 0) || ((*puVar6 & 0x7fc0000) == 0)) {
                      local_269 = '\0';
                    }
                    else {
                      local_535 = '\x01';
                      local_269 = '\x01';
                    }
                  }
                  else {
                    uVar1 = (&uStackY_494)[uVar4 * 4];
                    local_290 = (uint)uVar1;
                    if (local_290 == 0) {
LAB_0022194f:
                      if ((local_28c & 0x7fff) != 0) {
                        local_298 = (uint)(byte)X86InstDB::oSignatureData[lVar7 + 7];
                        if ((local_298 != 0) &&
                           ((abStackY_491[uVar4 * 8] & X86InstDB::oSignatureData[lVar7 + 7]) == 0))
                        {
                          local_269 = '\0';
                          goto LAB_002219a9;
                        }
                      }
                      local_269 = '\x01';
                    }
                    else {
                      uVar2 = *(ushort *)(X86InstDB::oSignatureData + lVar7 + 4);
                      local_294 = (uint)uVar2;
                      if ((uVar2 & uVar1) == 0) {
                        local_269 = '\0';
                      }
                      else {
                        if (((uVar2 & 0x800) == 0) || ((uVar1 & 0x800) != 0)) goto LAB_0022194f;
                        local_269 = '\0';
                      }
                    }
                  }
LAB_002219a9:
                  local_280 = puVar6;
                  local_278 = puVar5;
                  if (local_269 == '\0') break;
                  local_53c = local_53c + 1;
                }
              }
LAB_002219dc:
              if (local_530 == local_434) {
                if (local_535 == '\0') {
                  local_529 = '\0';
                  break;
                }
                local_529 = local_535;
              }
            }
            local_518 = local_518 + 8;
          } while (local_518 != local_520);
          if (local_518 == local_520) {
            if (local_529 != '\0') {
              return 0x2c;
            }
            return 0x16;
          }
        }
        local_238 = local_428 + 2;
        if ((*local_238 != 0) || ((local_450 & 0x9c0000) != 0)) {
          local_224 = 0x100000;
          if ((*local_510 & 0x100000) == 0) {
            if (((local_450 & 0x9c0000) != 0) || ((local_450 & 0xc000) == 0)) {
              return 0x16;
            }
          }
          else {
            if (*local_238 != 0) {
              if ((*local_238 >> 3 & 0x1f) != 0x12) {
                return 0x21;
              }
              local_204 = 0x1000000;
              local_218 = local_238;
              local_210 = local_510;
              local_200 = local_510;
              if ((*local_510 & 0x1000000) == 0) {
                return 0x22;
              }
            }
            if ((local_450 & 0x800000) != 0) {
              bVar8 = false;
              if ((local_450 & 0x800000) != 0) {
                local_1ec = 0x2000000;
                bVar8 = (*local_510 & 0x2000000) == 0;
                local_1f8 = local_510;
                local_1e8 = local_510;
              }
              if (bVar8) {
                return 0x23;
              }
            }
            if ((local_450 & 0x100000) != 0) {
              if (local_4a8 == (uint *)0x0) {
                return 0x24;
              }
              local_2d8 = local_4a8;
              uVar3 = *local_4a8 >> 0x18;
              if (uVar3 != 0) {
                local_1d4 = 0x10000000;
                local_594 = (*local_510 & 0x10000000) != 0 && uVar3 != 4;
                if (local_594) {
                  return 0x24;
                }
                in_stack_fffffffffffffe44 = 0x20000000;
                local_595 = (*local_510 & 0x20000000) != 0 && uVar3 != 8;
                local_1e0 = local_510;
                local_1d0 = local_510;
                local_1c8 = local_510;
                in_stack_fffffffffffffe48 = local_510;
                if (local_595) {
                  return 0x24;
                }
              }
              line = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
            }
            if ((local_450 & 0xc0000) != 0) {
              if (local_4a8 != (uint *)0x0) {
                return 0x25;
              }
              if ((local_450 & 0x40000) == 0) {
                if ((*local_510 & 0x8000000) == 0) {
                  return 0x25;
                }
              }
              else {
                if ((*local_510 & 0x4000000) == 0) {
                  return 0x25;
                }
                if ((*local_510 & 0x30000000) != 0) {
                  if (local_434 < 2) {
                    local_230 = local_238;
                    local_220 = local_510;
                    DebugUtils::assertionFailed
                              ((char *)local_510,line,
                               (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                              );
                  }
                  bVar8 = false;
                  if (*local_430 != 0x40000159) {
                    bVar8 = local_430[4] != 0x40000159;
                  }
                  if (bVar8) {
                    return 0x25;
                  }
                }
              }
            }
          }
        }
        local_41c = 0;
      }
    }
    else {
      local_41c = 3;
    }
  }
  return local_41c;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86InstImpl::validate(uint32_t archType, const Inst::Detail& detail, const Operand_* operands, uint32_t count) noexcept {
  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  uint32_t instId = detail.instId;
  uint32_t options = detail.options;

  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(count < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepRepnz) == kRepRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    // TODO: Validate extraReg {cx|ecx|rcx}.
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < count; i++) {
    const Operand_& op = operands[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == X86Reg::kRegRip && (opFlags & X86Inst::kOpVm))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < count) {
    while (--count > i)
      if (ASMJIT_UNLIKELY(!operands[count].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == X86Inst::kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iSigCount == count) {
        for (j = 0; j < count; j++)
          if (!x86CheckOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicit == count) {
        uint32_t r = 0;
        for (j = 0; j < count && r < iSigCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == count) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const RegOnly& extraReg = detail.extraReg;
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraReg.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraReg.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(extraReg.getType() != X86Reg::kRegK))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(count >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(operands[0]) && !X86Reg::isZmm(operands[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}